

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTransfer.cpp
# Opt level: O0

void __thiscall CTransfer::CTransfer(CTransfer *this,string *ip,int port)

{
  uint16_t uVar1;
  in_addr_t iVar2;
  char *__cp;
  int local_20;
  int i;
  int port_local;
  string *ip_local;
  CTransfer *this_local;
  
  this->_vptr_CTransfer = (_func_int **)&PTR___cxa_pure_virtual_0014f508;
  std::__cxx11::string::string((string *)&this->ip,(string *)ip);
  this->port = port;
  this->maxi = 0;
  this->nready = 0;
  bzero(&this->sockaddr,0x10);
  __cp = (char *)std::__cxx11::string::c_str();
  iVar2 = inet_addr(__cp);
  (this->sockaddr).sin_addr.s_addr = iVar2;
  uVar1 = htons((uint16_t)port);
  (this->sockaddr).sin_port = uVar1;
  (this->sockaddr).sin_family = 2;
  for (local_20 = 0; local_20 < 1000; local_20 = local_20 + 1) {
    this->pollfds[local_20].fd = -1;
  }
  return;
}

Assistant:

CTransfer::CTransfer(std::string ip,int port)
        :port(port),ip(ip),maxi(0),nready(0){
    bzero(&sockaddr,sizeof(sockaddr));
    sockaddr.sin_addr.s_addr = inet_addr(ip.c_str());
    sockaddr.sin_port = htons(port);
    sockaddr.sin_family = AF_INET;

    for(int i = 0;i < OPEN_MAX;i++){
        pollfds[i].fd = -1;
    }
}